

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObservers.cpp
# Opt level: O1

void __thiscall PhaseObserver::update(PhaseObserver *this)

{
  PlayerState PVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  pointer pcVar3;
  pointer ppCVar4;
  vector<CardType,_std::allocator<CardType>_> *pvVar5;
  GameLoop *pGVar6;
  ostream *poVar7;
  long *plVar8;
  pointer pCVar9;
  pointer ppCVar10;
  Country **neighbour;
  pointer ppCVar11;
  long *local_60;
  long local_58;
  long local_50 [2];
  pointer local_40;
  pointer local_38;
  
  pvVar2 = this->subject->pOwnedCountries;
  ppCVar10 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  ppCVar11 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  pGVar6 = GameLoop::getInstance();
  pvVar2 = pGVar6->gameMap->pMapCountries;
  if ((long)ppCVar10 - (long)ppCVar11 !=
      (long)(pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"#####################",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cout,*this->subject->pPlayerId);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," is ",4);
    poVar7 = operator<<(poVar7,*this->subject->currentState);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"#####################",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    plVar8 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    PVar1 = *this->subject->currentState;
    if (PVar1 == REINFORCING) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Your current hand: ",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      poVar7 = (ostream *)std::ostream::flush();
      local_60 = (long *)CONCAT71(local_60._1_7_,9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_60,1);
      pvVar5 = this->subject->pCards->handPointer;
      for (pCVar9 = (pvVar5->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar9 != (pvVar5->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                    super__Vector_impl_data._M_finish; pCVar9 = pCVar9 + 1) {
      }
      poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," infantry, ",0xb);
      pvVar5 = this->subject->pCards->handPointer;
      for (pCVar9 = (pvVar5->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar9 != (pvVar5->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                    super__Vector_impl_data._M_finish; pCVar9 = pCVar9 + 1) {
      }
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," artillery, ",0xc);
      pvVar5 = this->subject->pCards->handPointer;
      for (pCVar9 = (pvVar5->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar9 != (pvVar5->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                    super__Vector_impl_data._M_finish; pCVar9 = pCVar9 + 1) {
      }
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," cavalry",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"You own: ",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      pvVar2 = this->subject->pOwnedCountries;
      ppCVar10 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar11 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar10 != ppCVar11) {
        do {
          local_60 = (long *)CONCAT71(local_60._1_7_,9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_60,1);
          pcVar3 = ((*ppCVar10)->cyName->_M_dataplus)._M_p;
          local_60 = local_50;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,pcVar3,pcVar3 + (*ppCVar10)->cyName->_M_string_length);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_60,local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(*ppCVar10)->pNumberOfTroops);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," armies",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if (local_60 != local_50) {
            operator_delete(local_60,local_50[0] + 1);
          }
          ppCVar10 = ppCVar10 + 1;
        } while (ppCVar10 != ppCVar11);
      }
    }
    else if (PVar1 == FORTIFYING) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"You own:",8);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      pvVar2 = this->subject->pOwnedCountries;
      ppCVar10 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      local_40 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar10 != local_40) {
        do {
          local_60 = (long *)CONCAT71(local_60._1_7_,9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_60,1);
          pcVar3 = ((*ppCVar10)->cyName->_M_dataplus)._M_p;
          local_60 = local_50;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,pcVar3,pcVar3 + (*ppCVar10)->cyName->_M_string_length);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_60,local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(*ppCVar10)->pNumberOfTroops);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," armies",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if (local_60 != local_50) {
            operator_delete(local_60,local_50[0] + 1);
          }
          ppCVar4 = ((*ppCVar10)->pAdjCountries->
                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          local_38 = ppCVar10;
          for (ppCVar11 = ((*ppCVar10)->pAdjCountries->
                          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                          _M_impl.super__Vector_impl_data._M_start; ppCVar11 != ppCVar4;
              ppCVar11 = ppCVar11 + 1) {
            if (*(*ppCVar11)->pPlayerOwnerId == *this->subject->pPlayerId) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t-> ",5);
              pcVar3 = ((*ppCVar11)->cyName->_M_dataplus)._M_p;
              local_60 = local_50;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_60,pcVar3,pcVar3 + (*ppCVar11)->cyName->_M_string_length);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_60,local_58);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(*ppCVar11)->pNumberOfTroops);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," armies",7);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              if (local_60 != local_50) {
                operator_delete(local_60,local_50[0] + 1);
              }
            }
          }
          ppCVar10 = local_38 + 1;
        } while (ppCVar10 != local_40);
      }
    }
    else if (PVar1 == ATTACKING) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"You own:",8);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      pvVar2 = this->subject->pOwnedCountries;
      ppCVar10 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      local_40 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar10 != local_40) {
        do {
          local_60 = (long *)CONCAT71(local_60._1_7_,9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_60,1);
          pcVar3 = ((*ppCVar10)->cyName->_M_dataplus)._M_p;
          local_60 = local_50;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,pcVar3,pcVar3 + (*ppCVar10)->cyName->_M_string_length);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_60,local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(*ppCVar10)->pNumberOfTroops);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," armies",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if (local_60 != local_50) {
            operator_delete(local_60,local_50[0] + 1);
          }
          ppCVar4 = ((*ppCVar10)->pAdjCountries->
                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          local_38 = ppCVar10;
          for (ppCVar11 = ((*ppCVar10)->pAdjCountries->
                          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                          _M_impl.super__Vector_impl_data._M_start; ppCVar11 != ppCVar4;
              ppCVar11 = ppCVar11 + 1) {
            if (*(*ppCVar11)->pPlayerOwnerId != *this->subject->pPlayerId) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t-> ",5);
              pcVar3 = ((*ppCVar11)->cyName->_M_dataplus)._M_p;
              local_60 = local_50;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_60,pcVar3,pcVar3 + (*ppCVar11)->cyName->_M_string_length);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_60,local_58);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,": owned by Player ",0x12);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(*ppCVar11)->pPlayerOwnerId);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", with ",7);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(*ppCVar11)->pNumberOfTroops);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," armies",7);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              if (local_60 != local_50) {
                operator_delete(local_60,local_50[0] + 1);
              }
            }
          }
          ppCVar10 = local_38 + 1;
        } while (ppCVar10 != local_40);
      }
    }
  }
  return;
}

Assistant:

void PhaseObserver::update() {

    if (this->subject->getOwnedCountries()->size() ==
        GameLoop::getInstance()->getGameMap()->getMapCountries()->size()) {
        return;
    } else {
        std::cout << std::endl << "#####################" << std::endl;
        std::cout << "Player " << this->subject->getPlayerId() << " is " << subject->getPlayerState() << std::endl;
        std::cout << "#####################" << std::endl << std::endl;

        switch (subject->getPlayerState()) {
            case ATTACKING:
                std::cout << "You own:" << std::endl;
                for (const auto& country : *subject->getOwnedCountries()) {
                    std::cout << '\t' << country->getCountryName() << ": " << country->getNumberOfTroops() << " armies"
                              << std::endl;
                    for (const auto& neighbour : *country->getAdjCountries()) {
                        if (neighbour->getPlayerOwnerID() != subject->getPlayerId()) {
                            std::cout << "\t\t-> " << neighbour->getCountryName() << ": owned by Player "
                                      << neighbour->getPlayerOwnerID() << ", with " << neighbour->getNumberOfTroops()
                                      << " armies" << std::endl;
                        }
                    }
                }
                break;
            case DEFENDING:
                break;
            case FORTIFYING:
                std::cout << "You own:" << std::endl;
                for (const auto& country : *subject->getOwnedCountries()) {
                    std::cout << '\t' << country->getCountryName() << ": " << country->getNumberOfTroops() << " armies"
                              << std::endl;
                    for (const auto& neighbour : *country->getAdjCountries()) {
                        if (neighbour->getPlayerOwnerID() == subject->getPlayerId()) {
                            std::cout << "\t\t-> " << neighbour->getCountryName() << ": "
                                      << neighbour->getNumberOfTroops()
                                      << " armies" << std::endl;
                        }
                    }
                }
                break;
            case REINFORCING:
                std::cout << "Your current hand: " << std::endl << '\t';
                std::cout
                        << std::count(subject->getCards()->getHand()->begin(), subject->getCards()->getHand()->end(), 0)
                        << " infantry, "
                        << std::count(subject->getCards()->getHand()->begin(), subject->getCards()->getHand()->end(), 1)
                        << " artillery, "
                        << std::count(subject->getCards()->getHand()->begin(), subject->getCards()->getHand()->end(), 2)
                        << " cavalry" << std::endl;
                std::cout << "You own: " << std::endl;
                for (const auto& country : *subject->getOwnedCountries()) {
                    std::cout << '\t' << country->getCountryName() << ": " << country->getNumberOfTroops() << " armies"
                              << std::endl;
                }
                break;
            case IDLE:
                break;
        }
    }
}